

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_edge_cases.cpp
# Opt level: O3

number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
test_uintwide_t_edge::
generate_wide_integer_value<boost::multiprecision::number<boost::multiprecision::uintwide_t_backend<256u,unsigned_int,void>,(boost::multiprecision::expression_template_option)0>>
          (number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *__return_storage_ptr__,test_uintwide_t_edge *this,bool is_positive,
          local_base base_to_get,int digits_in_base_to_get)

{
  representation_type *prVar1;
  representation_type *prVar2;
  char __c;
  bool bVar3;
  result_type rVar4;
  undefined7 in_register_00000011;
  string str_x;
  int local_4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_4c = (int)CONCAT71(in_register_00000011,is_positive);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_48,(long)(int)base_to_get,'0');
  std::
  generate<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,test_uintwide_t_edge::generate_wide_integer_value<boost::multiprecision::number<boost::multiprecision::uintwide_t_backend<256u,unsigned_int,void>,(boost::multiprecision::expression_template_option)0>>(bool,test_uintwide_t_edge::local_base,int)::_lambda()_1_>
            ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_48._M_dataplus._M_p,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(local_48._M_dataplus._M_p + local_48._M_string_length),
             (anon_class_8_1_a530db20)&local_4c);
  if (local_4c == 1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace_aux
              (&local_48,0,0,1,'x');
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace_aux
              (&local_48,0,0,1,'0');
  }
  else if (local_4c == 2) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace_aux
              (&local_48,0,0,1,'0');
  }
  if (local_4c == 0) {
    __c = '+';
    if ((char)this == '\0') {
      rVar4 = std::uniform_int_distribution<unsigned_int>::operator()
                        ((uniform_int_distribution<unsigned_int> *)&dist_sgn,
                         (discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_24UL,_10UL,_24UL>,_223UL,_23UL>
                          *)&eng_sgn,(param_type *)&dist_sgn);
      __c = (rVar4 == 0) * '\x02' + '+';
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace_aux
              (&local_48,0,0,1,__c);
  }
  prVar2 = &(__return_storage_ptr__->m_backend).m_value.values;
  (prVar2->super_array<unsigned_int,_8UL>).elems[4] = 0;
  (prVar2->super_array<unsigned_int,_8UL>).elems[5] = 0;
  (prVar2->super_array<unsigned_int,_8UL>).elems[6] = 0;
  (prVar2->super_array<unsigned_int,_8UL>).elems[7] = 0;
  prVar1 = &(__return_storage_ptr__->m_backend).m_value;
  (prVar1->values).super_array<unsigned_int,_8UL>.elems[0] = 0;
  (prVar1->values).super_array<unsigned_int,_8UL>.elems[1] = 0;
  (prVar1->values).super_array<unsigned_int,_8UL>.elems[2] = 0;
  (prVar1->values).super_array<unsigned_int,_8UL>.elems[3] = 0;
  bVar3 = math::wide_integer::uintwide_t<256U,_unsigned_int,_void,_false>::rd_string
                    ((uintwide_t<256U,_unsigned_int,_void,_false> *)__return_storage_ptr__,
                     local_48._M_dataplus._M_p,0xffffffffffffffff,0);
  if (!bVar3) {
    (__return_storage_ptr__->m_backend).m_value.values.super_array<unsigned_int,_8UL>.elems[4] =
         0xffffffff;
    (__return_storage_ptr__->m_backend).m_value.values.super_array<unsigned_int,_8UL>.elems[5] =
         0xffffffff;
    (__return_storage_ptr__->m_backend).m_value.values.super_array<unsigned_int,_8UL>.elems[6] =
         0xffffffff;
    (__return_storage_ptr__->m_backend).m_value.values.super_array<unsigned_int,_8UL>.elems[7] =
         0xffffffff;
    (__return_storage_ptr__->m_backend).m_value.values.super_array<unsigned_int,_8UL>.elems[0] =
         0xffffffff;
    (__return_storage_ptr__->m_backend).m_value.values.super_array<unsigned_int,_8UL>.elems[1] =
         0xffffffff;
    (__return_storage_ptr__->m_backend).m_value.values.super_array<unsigned_int,_8UL>.elems[2] =
         0xffffffff;
    (__return_storage_ptr__->m_backend).m_value.values.super_array<unsigned_int,_8UL>.elems[3] =
         0xffffffff;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto generate_wide_integer_value(bool       is_positive           = true,
                                 local_base base_to_get           = local_base::dec,
                                 int        digits_in_base_to_get = std::numeric_limits<IntegralTypeWithStringConstruction>::digits10) -> IntegralTypeWithStringConstruction
{
  using local_integral_type = IntegralTypeWithStringConstruction;

  static_assert(   (  std::numeric_limits<local_integral_type>::is_signed  && std::numeric_limits<local_integral_type>::digits > static_cast<int>(INT8_C(63)))
                || ((!std::numeric_limits<local_integral_type>::is_signed) && std::numeric_limits<local_integral_type>::digits > static_cast<int>(INT8_C(64))),
                "Error: Integral type destination does not have enough digits10");

  std::string str_x(static_cast<std::size_t>(digits_in_base_to_get), '0');

  std::generate(str_x.begin(),
                str_x.end(),
                [&base_to_get]() // NOLINT(modernize-use-trailing-return-type,-warnings-as-errors)
                {
                  char c { };

                  if(base_to_get == local_base::oct)
                  {
                    c = static_cast<char>(dist_dig_oct(eng_dig));
                    c = static_cast<char>(c + '0');
                  }
                  else if(base_to_get == local_base::hex)
                  {
                    c = static_cast<char>(dist_dig_hex(eng_dig));

                    if(c < static_cast<char>(INT8_C(10)))
                    {
                      c = static_cast<char>(c + '0');
                    }
                    else
                    {
                      c =
                        static_cast<char>
                        (
                            static_cast<char>(c + 'A')
                          - static_cast<char>(INT8_C(10))
                        );
                    }
                  }
                  else
                  {
                    c = static_cast<char>(dist_dig_dec(eng_dig));
                    c = static_cast<char>(c + static_cast<char>(INT8_C(0x30)));
                  }

                  return c;
                });

  if(base_to_get == local_base::oct)
  {
    str_x.insert(str_x.begin(), static_cast<std::size_t>(UINT8_C(1)), '0');
  }
  else if(base_to_get == local_base::hex)
  {
    str_x.insert(str_x.begin(), static_cast<std::size_t>(UINT8_C(1)), 'x');
    str_x.insert(str_x.begin(), static_cast<std::size_t>(UINT8_C(1)), '0');
  }

  if(base_to_get == local_base::dec)
  {
    // Insert either a positive sign or a negative sign
    // (always one or the other) depending on the sign of x.
    const auto sign_char_to_insert =
      static_cast<char>
      (
        is_positive
          ? '+'
          : static_cast<char>((dist_sgn(eng_sgn) != static_cast<std::uint32_t>(UINT32_C(0))) ? '+' : '-') // NOLINT(readability-avoid-nested-conditional-operator)
      );

    str_x.insert(str_x.begin(), static_cast<std::size_t>(UINT8_C(1)), sign_char_to_insert);
  }

  return local_integral_type(str_x.c_str());
}